

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

Production * lookup_production(Grammar *g,char *name,uint l)

{
  Production *pPVar1;
  int iVar2;
  Production *pp;
  uint i;
  uint l_local;
  char *name_local;
  Grammar *g_local;
  
  pp._0_4_ = 0;
  while( true ) {
    if ((g->productions).n <= (uint)pp) {
      return (Production *)0x0;
    }
    pPVar1 = (g->productions).v[(uint)pp];
    if ((pPVar1->name_len == l) && (iVar2 = strncmp(pPVar1->name,name,(ulong)l), iVar2 == 0)) break;
    pp._0_4_ = (uint)pp + 1;
  }
  return pPVar1;
}

Assistant:

Production *lookup_production(Grammar *g, char *name, uint l) {
  uint i;

  for (i = 0; i < g->productions.n; i++) {
    Production *pp = g->productions.v[i];
    if (pp->name_len != l || strncmp(pp->name, name, l)) continue;
    return pp;
  }
  return NULL;
}